

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_copy_to_file.cpp
# Opt level: O3

vector<duckdb::ColumnBinding,_true> * __thiscall
duckdb::LogicalCopyToFile::GetColumnBindings
          (vector<duckdb::ColumnBinding,_true> *__return_storage_ptr__,LogicalCopyToFile *this)

{
  unsigned_long uVar1;
  long lVar2;
  int local_44;
  unsigned_long local_40;
  unsigned_long local_38;
  
  GetCopyFunctionReturnLogicalTypes
            ((vector<duckdb::LogicalType,_true> *)&local_40,this->return_type);
  uVar1 = local_40;
  lVar2 = local_38 - local_40;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_40);
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40 = 0;
  if (local_38 != uVar1) {
    do {
      local_44 = 0;
      ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
      emplace_back<int,unsigned_long&>
                ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)
                 __return_storage_ptr__,&local_44,&local_40);
      local_40 = local_40 + 1;
    } while (local_40 < (ulong)((lVar2 >> 3) * -0x5555555555555555));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ColumnBinding> LogicalCopyToFile::GetColumnBindings() {
	idx_t return_column_count = GetCopyFunctionReturnLogicalTypes(return_type).size();
	vector<ColumnBinding> result;
	for (idx_t i = 0; i < return_column_count; i++) {
		result.emplace_back(0, i);
	}
	return result;
}